

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void WriteCompactSize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
               (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                *os,uint64_t nSize)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ser_writedata8<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
                (os,(uint8_t)nSize);
      return;
    }
  }
  else if (nSize < 0x10000) {
    ser_writedata8<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
              (os,0xfd);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ser_writedata16<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
                (os,(uint16_t)nSize);
      return;
    }
  }
  else if (nSize >> 0x20 == 0) {
    ser_writedata8<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
              (os,0xfe);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ser_writedata32<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
                (os,(uint32_t)nSize);
      return;
    }
  }
  else {
    ser_writedata8<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
              (os,0xff);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ser_writedata64<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
                (os,nSize);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}